

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

void __thiscall
clickhouse::ColumnVector<absl::int128>::ColumnVector(ColumnVector<absl::int128> *this)

{
  undefined8 *in_RDI;
  TypeRef *in_stack_ffffffffffffffd8;
  Column *in_stack_ffffffffffffffe0;
  
  Type::CreateSimple<absl::int128>();
  Column::Column(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::shared_ptr<clickhouse::Type>::~shared_ptr((shared_ptr<clickhouse::Type> *)0x21842b);
  *in_RDI = &PTR__ColumnVector_002a0578;
  std::vector<absl::int128,_std::allocator<absl::int128>_>::vector
            ((vector<absl::int128,_std::allocator<absl::int128>_> *)0x218446);
  return;
}

Assistant:

ColumnVector<T>::ColumnVector()
    : Column(Type::CreateSimple<T>())
{
}